

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O1

DecodeStatus DecodeMRRC2(MCInst *Inst,uint Val,uint64_t Address,void *Decoder)

{
  bool bVar1;
  DecodeStatus DVar2;
  DecodeStatus DVar3;
  uint64_t Address_00;
  uint64_t Address_01;
  uint RegNo;
  DecodeStatus DVar4;
  uint RegNo_00;
  DecodeStatus DVar5;
  
  DVar2 = MCDisassembler_Fail;
  if ((Val & 0xe00) != 0xa00) {
    RegNo_00 = Val >> 0x10 & 0xf;
    RegNo = Val >> 0xc & 0xf;
    MCOperand_CreateImm0(Inst,(ulong)(Val >> 8 & 0xf));
    MCOperand_CreateImm0(Inst,(ulong)(Val >> 4 & 0xf));
    DVar2 = DecodeGPRnopcRegisterClass(Inst,RegNo,Address_00,Decoder);
    if (DVar2 == MCDisassembler_Fail) {
      bVar1 = false;
      DVar4 = DVar2;
    }
    else {
      DVar3 = (uint)(RegNo != RegNo_00) * 2 + MCDisassembler_SoftFail;
      Decoder = (void *)(ulong)DVar3;
      bVar1 = true;
      DVar4 = DVar3;
      if ((DVar2 != MCDisassembler_Success) && (DVar4 = DVar2, DVar2 != MCDisassembler_SoftFail)) {
        bVar1 = false;
        DVar4 = DVar3;
      }
    }
    DVar2 = MCDisassembler_Fail;
    if (bVar1) {
      DVar3 = DecodeGPRnopcRegisterClass(Inst,RegNo_00,Address_01,Decoder);
      if (DVar3 == MCDisassembler_Fail) {
        bVar1 = false;
        DVar5 = DVar3;
      }
      else {
        bVar1 = true;
        DVar5 = DVar4;
        if ((DVar3 != MCDisassembler_Success) && (DVar5 = DVar3, DVar3 != MCDisassembler_SoftFail))
        {
          bVar1 = false;
          DVar5 = DVar4;
        }
      }
      if (bVar1) {
        MCOperand_CreateImm0(Inst,(ulong)(Val & 0xf));
        DVar2 = DVar5;
      }
    }
  }
  return DVar2;
}

Assistant:

static DecodeStatus DecodeMRRC2(MCInst *Inst, unsigned Val,
		uint64_t Address, const void *Decoder)
{

	DecodeStatus S = MCDisassembler_Success;

	unsigned CRm = fieldFromInstruction_4(Val, 0, 4);
	unsigned opc1 = fieldFromInstruction_4(Val, 4, 4);
	unsigned cop = fieldFromInstruction_4(Val, 8, 4);
	unsigned Rt = fieldFromInstruction_4(Val, 12, 4);
	unsigned Rt2 = fieldFromInstruction_4(Val, 16, 4);

	if ((cop & ~0x1) == 0xa)
		return MCDisassembler_Fail;

	if (Rt == Rt2)
		S = MCDisassembler_SoftFail;

	MCOperand_CreateImm0(Inst, cop);
	MCOperand_CreateImm0(Inst, opc1);
	if (!Check(&S, DecodeGPRnopcRegisterClass(Inst, Rt, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeGPRnopcRegisterClass(Inst, Rt2, Address, Decoder)))
		return MCDisassembler_Fail;
	MCOperand_CreateImm0(Inst, CRm);

	return S;
}